

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftNoNZ(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *vec)

{
  int iVar1;
  pointer pnVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  type_conflict5 tVar6;
  long lVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  int iVar9;
  long lVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  long lVar12;
  int *piVar13;
  bool bVar14;
  byte bVar15;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar15 = 0;
  pnVar2 = (this->l).rval.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar3 = (this->l).ridx;
  piVar4 = (this->l).rbeg;
  piVar5 = (this->l).rorig;
  lVar10 = (long)this->thedim;
  while (bVar14 = lVar10 != 0, lVar10 = lVar10 + -1, bVar14) {
    lVar12 = (long)piVar5[lVar10];
    pnVar11 = vec + lVar12;
    pcVar8 = &local_b0;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pcVar8->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
      pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar15 * -8 + 4);
    }
    local_b0.exp = vec[lVar12].m_backend.exp;
    local_b0.neg = vec[lVar12].m_backend.neg;
    local_b0.fpclass = vec[lVar12].m_backend.fpclass;
    local_b0.prec_elem = vec[lVar12].m_backend.prec_elem;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    tVar6 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_b0,(double *)&local_138);
    if (tVar6) {
      iVar1 = piVar4[lVar12];
      piVar13 = piVar3 + iVar1;
      pcVar8 = &pnVar2[iVar1].m_backend;
      for (iVar9 = piVar4[lVar12 + 1] - iVar1; 0 < iVar9; iVar9 = iVar9 + -1) {
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x1c;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems[0xe] = 0;
        local_138.data._M_elems[0xf] = 0;
        local_138.data._M_elems[0x10] = 0;
        local_138.data._M_elems[0x11] = 0;
        local_138.data._M_elems[0x12] = 0;
        local_138.data._M_elems[0x13] = 0;
        local_138.data._M_elems[0x14] = 0;
        local_138.data._M_elems[0x15] = 0;
        local_138.data._M_elems[0x16] = 0;
        local_138.data._M_elems[0x17] = 0;
        local_138.data._M_elems[0x18] = 0;
        local_138.data._M_elems[0x19] = 0;
        local_138.data._M_elems._104_5_ = 0;
        local_138.data._M_elems[0x1b]._1_3_ = 0;
        local_138.exp = 0;
        local_138.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_138,&local_b0,pcVar8);
        iVar1 = *piVar13;
        piVar13 = piVar13 + 1;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&vec[iVar1].m_backend,&local_138);
        pcVar8 = pcVar8 + 1;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleftNoNZ(R* vec)
{
   int i, j, k;
   int r;
   R x;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig;

   ridx = l.ridx;
   rval = l.rval.data();
   rbeg = l.rbeg;
   rorig = l.rorig;

#ifndef SOPLEX_WITH_L_ROWS
   R* lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   i = l.firstUpdate - 1;
   assert(i < thedim);

   for(; i >= 0; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         x += vec[*idx++] * (*val++);
      }

      vec[lrow[i]] -= x;
   }

#else

   for(i = thedim; i--;)
   {
      r = rorig[i];
      x = vec[r];

      if(x != 0.0)
      {
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            vec[*idx++] -= x * *val++;
         }
      }
   }

#endif
}